

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_12,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  int col_1;
  long lVar7;
  int col;
  undefined4 uVar8;
  Mat4x3 m;
  float afStack_d8 [6];
  float local_c0 [4];
  float local_b0 [2];
  ulong local_a8;
  undefined4 local_a0;
  float local_98 [8];
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  float fStack_5c;
  Vector<float,_3> res_1;
  Matrix<float,_3,_4> retVal;
  
  pfVar1 = retVal.m_data.m_data[0].m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar6 != 3);
    retVal.m_data.m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    retVal.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[0];
    retVal.m_data.m_data[1].m_data[1] = evalCtx->in[0].m_data[2];
    retVal.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    retVal.m_data.m_data._32_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    retVal.m_data.m_data[3].m_data[2] = evalCtx->in[3].m_data[0];
    retVal.m_data.m_data[3].m_data[1] = evalCtx->in[2].m_data[2];
  }
  else {
    retVal.m_data.m_data[3].m_data[1] = 0.0;
    retVal.m_data.m_data[3].m_data[2] = 0.0;
    retVal.m_data.m_data[2].m_data[0] = 0.0;
    retVal.m_data.m_data[2].m_data[1] = 0.0;
    retVal.m_data.m_data[2].m_data[2] = 0.0;
    retVal.m_data.m_data[3].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x3;
    lVar2 = 0;
    do {
      lVar6 = 0;
      pfVar4 = pfVar1;
      do {
        *pfVar4 = (float)puVar3[lVar6];
        lVar6 = lVar6 + 1;
        pfVar4 = pfVar4 + 3;
      } while (lVar6 != 4);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = res.m_data;
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar6 != 3);
    res.m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    stack0xffffffffffffffa0 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    retVal.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
  }
  else {
    pfVar1 = res.m_data;
    retVal.m_data.m_data[0].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[1] = 0.0;
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    stack0xffffffffffffffa0 = 0;
    puVar3 = &DAT_00af0b90;
    lVar2 = 0;
    do {
      lVar6 = 0;
      pfVar4 = pfVar1;
      do {
        ((Vector<float,_3> *)pfVar4)->m_data[0] = (float)puVar3[lVar6];
        lVar6 = lVar6 + 1;
        pfVar4 = (float *)((long)pfVar4 + 0xc);
      } while (lVar6 != 4);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 3);
  }
  pfVar1 = local_98;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  stack0xffffffffffffff90 = 0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  lVar2 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0xc;
  } while (lVar6 != 3);
  pfVar1 = local_98;
  pfVar4 = res.m_data;
  pfVar5 = retVal.m_data.m_data[0].m_data + 2;
  lVar2 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pfVar1 + lVar6) =
           *(float *)((long)pfVar5 + lVar6) * *(float *)((long)pfVar4 + lVar6);
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
    pfVar4 = pfVar4 + 1;
    pfVar5 = pfVar5 + 1;
  } while (lVar2 != 3);
  local_c0[2] = 0.0;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar2 = 0;
  do {
    local_c0[lVar2] = local_98[lVar2] + local_98[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a8 = local_a8 & 0xffffffff00000000;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  lVar2 = 0;
  do {
    local_b0[lVar2] = local_c0[lVar2] + res_2.m_data[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_d8[4] = 0.0;
  afStack_d8[2] = 0.0;
  afStack_d8[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_d8[lVar2 + 2] = local_b0[lVar2] + res_2.m_data[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar2]] = afStack_d8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}